

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

double __thiscall pstore::logger::log(logger *this,double __x)

{
  long in_RCX;
  czstring in_RDX;
  uint in_ESI;
  double dVar1;
  string local_48;
  long d_local;
  czstring message_local;
  logger *plStack_10;
  priority p_local;
  logger *this_local;
  
  plStack_10 = this;
  to_string<long>(&local_48,in_RDX,in_RCX);
  (*this->_vptr_logger[2])(this,(ulong)in_ESI,&local_48);
  dVar1 = (double)std::__cxx11::string::~string((string *)&local_48);
  return dVar1;
}

Assistant:

void logger::log (priority const p, gsl::czstring const message, long const d) {
            this->log (p, to_string (message, d));
        }